

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clone.cpp
# Opt level: O3

void __thiscall
helics::apps::Clone::Clone(Clone *this,string_view appName,CoreApp *core,FederateInfo *fedInfo)

{
  _Rb_tree_header *p_Var1;
  
  apps::App::App(&this->super_App,appName,core,fedInfo);
  (this->super_App)._vptr_App = (_func_int **)&PTR__Clone_005126e0;
  this->allow_iteration = false;
  this->verbose = false;
  this->fileSaved = false;
  (this->nextPrintTimeStep).internalTimeCode = 0;
  (this->cFilt)._M_t.
  super___uniq_ptr_impl<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_>._M_t.
  super__Tuple_impl<0UL,_helics::CloningFilter_*,_std::default_delete<helics::CloningFilter>_>.
  super__Head_base<0UL,_helics::CloningFilter_*,_false>._M_head_impl = (CloningFilter *)0x0;
  (this->points).
  super__Vector_base<helics::apps::Clone::ValueCapture,_std::allocator<helics::apps::Clone::ValueCapture>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->points).
  super__Vector_base<helics::apps::Clone::ValueCapture,_std::allocator<helics::apps::Clone::ValueCapture>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->points).
  super__Vector_base<helics::apps::Clone::ValueCapture,_std::allocator<helics::apps::Clone::ValueCapture>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->subscriptions).super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->subscriptions).super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->subscriptions).super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->subscriptions).super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->subscriptions).super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->subscriptions).super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->subscriptions).super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->subscriptions).super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->subscriptions).super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->subscriptions).super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  CLI::std::_Deque_base<helics::Input,_std::allocator<helics::Input>_>::_M_initialize_map
            (&(this->subscriptions).super__Deque_base<helics::Input,_std::allocator<helics::Input>_>
             ,0);
  p_Var1 = &(this->subids)._M_t._M_impl.super__Rb_tree_header;
  (this->subids)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->subids)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->cloneSubscriptionNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cloneSubscriptionNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cloneSubscriptionNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cloneEndpoint)._M_t.
  super___uniq_ptr_impl<helics::Endpoint,_std::default_delete<helics::Endpoint>_>._M_t.
  super__Tuple_impl<0UL,_helics::Endpoint_*,_std::default_delete<helics::Endpoint>_>.
  super__Head_base<0UL,_helics::Endpoint_*,_false>._M_head_impl = (Endpoint *)0x0;
  (this->messages).
  super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->messages).
  super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->messages).
  super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->subids)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->subids)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->subids)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->subkeys)._M_t._M_impl.super__Rb_tree_header;
  (this->subkeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->subkeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->subkeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->subkeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->subkeys)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->eptids)._M_t._M_impl.super__Rb_tree_header;
  (this->eptids)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->eptids)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->eptids)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->eptids)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->eptids)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->eptNames)._M_t._M_impl.super__Rb_tree_header;
  (this->eptNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->eptNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->eptNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->eptNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->eptNames)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->captureFederate)._M_dataplus._M_p = (pointer)&(this->captureFederate).field_2;
  (this->captureFederate)._M_string_length = 0;
  (this->captureFederate).field_2._M_local_buf[0] = '\0';
  (this->fedConfig)._M_dataplus._M_p = (pointer)&(this->fedConfig).field_2;
  (this->fedConfig)._M_string_length = 0;
  (this->fedConfig).field_2._M_local_buf[0] = '\0';
  (this->pubPointCount).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->pubPointCount).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pubPointCount).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  initialSetup(this);
  return;
}

Assistant:

Clone::Clone(std::string_view appName, CoreApp& core, const FederateInfo& fedInfo):
    App(appName, core, fedInfo)
{
    initialSetup();
}